

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hh
# Opt level: O0

uint64_t __thiscall kratos::Generator::child_count(Generator *this)

{
  uint64_t uVar1;
  size_type sVar2;
  uint64_t local_20;
  Generator *this_local;
  
  if ((this->is_external_ & 1U) == 0) {
    uVar1 = stmts_count(this);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
            ::size(&this->funcs_);
    local_20 = get_child_generator_size(this);
    local_20 = uVar1 + sVar2 + local_20;
  }
  else {
    local_20 = 0;
  }
  return local_20;
}

Assistant:

uint64_t inline child_count() override {
        return is_external_ ? 0 : stmts_count() + funcs_.size() + get_child_generator_size();
    }